

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O1

Instr * __thiscall
LowererMDArch::LoadDoubleHelperArgument(LowererMDArch *this,Instr *instrInsert,Opnd *opndArg)

{
  code *pcVar1;
  bool bVar2;
  RegOpnd *dstOpnd;
  Instr *pIVar3;
  undefined4 *puVar4;
  
  if (opndArg->m_type == TyFloat32) {
    dstOpnd = IR::RegOpnd::New(TyFloat64,this->m_func);
    pIVar3 = IR::Instr::New(CVTSS2SD,&dstOpnd->super_Opnd,opndArg,this->m_func);
    IR::Instr::InsertBefore(instrInsert,pIVar3);
  }
  if (1 < (byte)(opndArg->m_type - TyFloat32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x5c8,"(opndArg->IsFloat())","opndArg->IsFloat()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pIVar3 = LoadHelperArgument(this,instrInsert,opndArg);
  return pIVar3;
}

Assistant:

IR::Instr *
LowererMDArch::LoadDoubleHelperArgument(IR::Instr * instrInsert, IR::Opnd * opndArg)
{
    IR::Opnd * float64Opnd;
    if (opndArg->GetType() == TyFloat32)
    {
        float64Opnd = IR::RegOpnd::New(TyFloat64, m_func);
        IR::Instr * instr = IR::Instr::New(Js::OpCode::CVTSS2SD, float64Opnd, opndArg, this->m_func);
        instrInsert->InsertBefore(instr);
    }
    else
    {
        float64Opnd = opndArg;
    }

    Assert(opndArg->IsFloat());

    return LoadHelperArgument(instrInsert, opndArg);
}